

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * __thiscall
trieste::
T<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,Token *type2,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3,TokenDef *types_4,TokenDef *types_5,
          TokenDef *types_6,TokenDef *types_7,TokenDef *types_8,TokenDef *types_9,TokenDef *types_10
          )

{
  initializer_list<trieste::Token> __l;
  initializer_list<trieste::Token> __l_00;
  allocator<trieste::Token> local_212;
  less<trieste::Token> local_211;
  Token local_210;
  TokenDef *local_208;
  Token local_200;
  Token local_1f8;
  Token local_1f0;
  Token local_1e8;
  Token local_1e0;
  Token local_1d8;
  Token local_1d0;
  Token local_1c8;
  Token local_1c0;
  Token local_1b8;
  Token local_1b0;
  iterator local_1a8;
  size_type local_1a0;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_198;
  FastPattern local_168;
  undefined1 local_100 [55];
  allocator<trieste::Token> local_c9;
  Token local_c8;
  TokenDef *local_c0;
  Token local_b8;
  Token local_b0;
  Token local_a8;
  Token local_a0;
  Token local_98;
  Token local_90;
  Token local_88;
  Token local_80;
  Token local_78;
  Token local_70;
  Token local_68;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<trieste::Token,_std::allocator<trieste::Token>_> types_;
  TokenDef *types_local_2;
  TokenDef *types_local_1;
  TokenDef *types_local;
  Token *type2_local;
  Token *type1_local;
  
  local_c8.def = *(TokenDef **)this;
  local_c0 = type1->def;
  types_.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)types_1;
  Token::Token(&local_b8,(TokenDef *)type2);
  Token::Token(&local_b0,types);
  Token::Token(&local_a8,
               (TokenDef *)
               types_.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  Token::Token(&local_a0,types_2);
  Token::Token(&local_98,types_3);
  Token::Token(&local_90,types_4);
  Token::Token(&local_88,types_5);
  Token::Token(&local_80,types_6);
  Token::Token(&local_78,types_7);
  Token::Token(&local_70,types_8);
  Token::Token(&local_68,types_9);
  local_60 = &local_c8;
  local_58 = 0xd;
  std::allocator<trieste::Token>::allocator(&local_c9);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_50,__l_00,&local_c9);
  std::allocator<trieste::Token>::~allocator(&local_c9);
  std::
  make_shared<trieste::detail::TokenMatch,std::vector<trieste::Token,std::allocator<trieste::Token>>&>
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_100);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::TokenMatch,void>
            ((shared_ptr<trieste::detail::PatternDef> *)(local_100 + 0x10),
             (shared_ptr<trieste::detail::TokenMatch> *)local_100);
  local_210.def = *(TokenDef **)this;
  local_208 = type1->def;
  Token::Token(&local_200,(TokenDef *)type2);
  Token::Token(&local_1f8,types);
  Token::Token(&local_1f0,
               (TokenDef *)
               types_.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  Token::Token(&local_1e8,types_2);
  Token::Token(&local_1e0,types_3);
  Token::Token(&local_1d8,types_4);
  Token::Token(&local_1d0,types_5);
  Token::Token(&local_1c8,types_6);
  Token::Token(&local_1c0,types_7);
  Token::Token(&local_1b8,types_8);
  Token::Token(&local_1b0,types_9);
  local_1a8 = &local_210;
  local_1a0 = 0xd;
  std::allocator<trieste::Token>::allocator(&local_212);
  __l._M_len = local_1a0;
  __l._M_array = local_1a8;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_198,__l,&local_211,&local_212);
  detail::FastPattern::match_token(&local_168,&local_198);
  detail::Pattern::Pattern(__return_storage_ptr__,(PatternPtr *)(local_100 + 0x10),&local_168);
  detail::FastPattern::~FastPattern(&local_168);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_198);
  std::allocator<trieste::Token>::~allocator(&local_212);
  std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)(local_100 + 0x10));
  std::shared_ptr<trieste::detail::TokenMatch>::~shared_ptr
            ((shared_ptr<trieste::detail::TokenMatch> *)local_100);
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::~vector
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern
  T(const Token& type1, const Token& type2, const Ts&... types)
  {
    std::vector<Token> types_ = {type1, type2, types...};
    return detail::Pattern(
      std::make_shared<detail::TokenMatch>(types_),
      detail::FastPattern::match_token({type1, type2, types...}));
  }